

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O1

boolean create_room(level *lev,xchar x,xchar y,xchar w,xchar h,xchar xal,xchar yal,xchar rtype,
                   xchar rlit)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  xchar xVar4;
  byte bVar5;
  boolean bVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  nhrect *r1;
  int iVar10;
  int iVar11;
  char cVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  char cVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  bool bVar23;
  xchar yabs;
  xchar xabs;
  xchar dy;
  xchar dx;
  nhrect r2;
  char local_58;
  char local_50;
  
  if (rtype == -1) {
    rtype = '\0';
  }
  uVar3 = (uint)(rtype == '\x04');
  if (rlit == -1) {
    bVar5 = depth(&lev->z);
    uVar7 = mt_random();
    rlit = '\0';
    if (uVar7 % (uint)(byte)(((bVar5 ^ (char)bVar5 >> 7) - ((char)bVar5 >> 7)) + 1) < 10) {
      uVar7 = mt_random();
      rlit = 0x3531dec < uVar7 * 0x3f2b3885;
    }
  }
  iVar15 = (int)w;
  iVar16 = (int)h;
  uVar7 = 0;
  do {
    iVar20 = iVar15;
    iVar14 = iVar16;
    if ((char)(w & xal & y & x & yal) < '\0' || rtype == '\x04') {
      r1 = rnd_rect();
      if (r1 == (nhrect *)0x0) {
        iVar22 = 1;
LAB_00249d95:
        r1 = (nhrect *)0x0;
      }
      else {
        cVar12 = r1->hx;
        iVar19 = (int)cVar12;
        cVar1 = r1->hy;
        cVar18 = r1->lx;
        iVar21 = (int)cVar18;
        cVar2 = r1->ly;
        if (rtype == '\x04') {
          dy = '\x01';
          dx = '\x01';
        }
        else {
          uVar9 = mt_random();
          bVar5 = (char)(uVar9 % ((uint)(0x1c < iVar19 - iVar21) * 4 + 8)) + 2;
          dx = bVar5;
          uVar9 = mt_random();
          dy = ((byte)uVar9 & 3) + 2;
          if (0x32 < (byte)(dy * bVar5)) {
            dy = 0x32 / bVar5;
          }
        }
        xVar4 = dy;
        iVar8 = uVar3 + 5;
        if (cVar12 < 'O') {
          iVar8 = (uVar3 + 4) * 2;
        }
        if (cVar18 < '\x01') {
          iVar8 = uVar3 + 5;
        }
        iVar10 = (int)dx;
        iVar22 = 3;
        if (iVar8 + iVar10 + 3 <= iVar19 - iVar21) {
          iVar13 = uVar3 + 4;
          if (cVar1 < '\x14') {
            iVar13 = (uVar3 + 3) * 2;
          }
          if (cVar2 < '\x01') {
            iVar13 = uVar3 + 4;
          }
          iVar17 = (int)dy;
          if (iVar13 + iVar17 + 3 <= (int)cVar1 - (int)cVar2) {
            local_50 = (char)(uVar3 + 4);
            cVar12 = '\x03';
            if ('\0' < cVar18) {
              cVar12 = local_50;
            }
            iVar11 = 3;
            if ('\0' < cVar18) {
              iVar11 = iVar21;
            }
            uVar9 = mt_random();
            xabs = SUB161(ZEXT416(uVar9) % SEXT816((long)((iVar19 - (iVar11 + iVar10 + iVar8)) + 1))
                          ,0) + cVar12 + cVar18;
            local_58 = (char)(uVar3 + 3);
            cVar12 = '\x02';
            if ('\0' < cVar2) {
              cVar12 = local_58;
            }
            iVar19 = 2;
            if ('\0' < cVar2) {
              iVar19 = (int)cVar2;
            }
            uVar9 = mt_random();
            cVar12 = SUB161(ZEXT416(uVar9) %
                            SEXT816((long)(((int)cVar1 - (iVar19 + iVar17 + iVar13)) + 1)),0) +
                     cVar12 + cVar2;
            yabs = cVar12;
            if (('\x13' < cVar1 && cVar2 == '\0') &&
               (((iVar19 = lev->nroom, (long)iVar19 == 0 ||
                 (uVar9 = mt_random(), SUB168(ZEXT416(uVar9) % SEXT816((long)iVar19),0) == 0)) &&
                (10 < cVar12 + iVar17)))) {
              uVar9 = mt_random();
              yabs = (char)uVar9 + (char)(uVar9 / 3) * -3 + '\x02';
              if ((1 < (byte)xVar4) && (lev->nroom < 4)) {
                dy = xVar4 + -1;
              }
            }
            bVar6 = check_room(lev,&xabs,&dx,&yabs,&dy,rtype == '\x04');
            if (bVar6 != '\0') {
              iVar20 = dx + 1;
              iVar14 = dy + 1;
              r2.lx = xabs + -1;
              r2.ly = yabs + -1;
              r2.hx = xabs + (char)iVar20;
              r2.hy = (char)iVar14 + yabs;
              goto LAB_00249e78;
            }
            goto LAB_00249d95;
          }
        }
        r1 = (nhrect *)0x0;
      }
    }
    else {
      bVar23 = (char)(y & x) < '\0';
      iVar22 = (int)x;
      iVar19 = (int)y;
      if (bVar23) {
        uVar9 = mt_random();
        iVar22 = uVar9 % 5 + 1;
        uVar9 = mt_random();
        iVar19 = uVar9 % 5 + 1;
      }
      if ((char)(h | w) < '\0') {
        uVar9 = mt_random();
        iVar20 = uVar9 % 0xf + 3;
        uVar9 = mt_random();
        iVar14 = (uVar9 & 7) + 2;
      }
      iVar21 = (int)xal;
      if (xal == -1) {
        uVar9 = mt_random();
        iVar21 = uVar9 % 3 + 1;
      }
      iVar8 = (int)yal;
      if (yal == -1) {
        uVar9 = mt_random();
        iVar8 = uVar9 % 3 + 1;
      }
      iVar22 = iVar22 * 0x50 + -0x50;
      cVar12 = (char)(uint)((ulong)((long)iVar22 * 0x66666667) >> 0x21) - (char)(iVar22 >> 0x1f);
      xabs = cVar12 + '\x01';
      iVar22 = iVar19 * 0x15 + -0x15;
      cVar1 = (char)(uint)((ulong)((long)iVar22 * 0x66666667) >> 0x21) - (char)(iVar22 >> 0x1f);
      yabs = cVar1 + '\x01';
      cVar18 = (char)iVar20;
      if (iVar21 == 3) {
        xabs = xabs + (char)((uint)((0x10 - iVar20) - (0x10 - iVar20 >> 0x1f)) >> 1);
      }
      else if (iVar21 == 5) {
        xabs = (cVar12 - cVar18) + '\x11';
      }
      cVar12 = (char)iVar14;
      if (iVar8 == 3) {
        yabs = yabs + (char)((uint)((4 - iVar14) - (4 - iVar14 >> 0x1f)) >> 1);
      }
      else if (iVar8 == 5) {
        yabs = (cVar1 - cVar12) + '\x05';
      }
      if (0x4f < xabs + iVar20) {
        xabs = 'M' - cVar18;
      }
      if (xabs < '\x03') {
        xabs = '\x02';
      }
      if (0x14 < yabs + iVar14) {
        yabs = '\x12' - cVar12;
      }
      if (yabs < '\x03') {
        yabs = '\x02';
      }
      r2.lx = xabs + -1;
      r2.ly = yabs + -1;
      r2.hx = cVar18 + bVar23 + xabs;
      r2.hy = bVar23 + cVar12 + yabs;
      r1 = get_rect(&r2);
LAB_00249e78:
      iVar22 = 0;
    }
    if ((iVar22 != 3) && (iVar22 != 0)) goto LAB_0024a121;
  } while ((uVar7 < 100) && (uVar7 = uVar7 + 1, r1 == (nhrect *)0x0));
  if (r1 == (nhrect *)0x0) {
LAB_0024a121:
    bVar6 = '\0';
  }
  else {
    split_rects(r1,&r2);
    if (rtype == '\x04') {
      iVar15 = lev->nroom;
      lev->rooms[iVar15].lx = xabs;
      lev->rooms[iVar15].ly = yabs;
    }
    else {
      smeq[lev->nroom] = lev->nroom;
      add_room(lev,(int)xabs,(int)yabs,iVar20 + -1 + (int)xabs,iVar14 + -1 + (int)yabs,rlit,rtype,
               '\0');
    }
    bVar6 = '\x01';
  }
  return bVar6;
}

Assistant:

boolean create_room(struct level *lev, xchar x, xchar y, xchar w, xchar h,
		    xchar xal, xchar yal, xchar rtype, xchar rlit)
{
	xchar xabs, yabs;
	int wtmp, htmp, xaltmp, yaltmp, xtmp, ytmp;
	struct nhrect *r1 = NULL, r2;
	int trycnt = 0;
	boolean vault = FALSE;
	int xlim = XLIM, ylim = YLIM;

	if (rtype == -1)	/* Is the type random ? */
	    rtype = OROOM;

	if (rtype == VAULT) {
		vault = TRUE;
		xlim++;
		ylim++;
	}

	/* on low levels the room is lit (usually) */
	/* some other rooms may require lighting */

	/* is light state random ? */
	if (rlit == -1)
	    rlit = (rnd(1+abs(depth(&lev->z))) < 11 && rn2(77)) ? TRUE : FALSE;

	/*
	 * Here we will try to create a room. If some parameters are
	 * random we are willing to make several try before we give
	 * it up.
	 */
	do {
		xchar xborder, yborder;
		wtmp = w; htmp = h;
		xtmp = x; ytmp = y;
		xaltmp = xal; yaltmp = yal;

		/* First case : a totaly random room */

		if ((xtmp < 0 && ytmp <0 && wtmp < 0 && xaltmp < 0 &&
		   yaltmp < 0) || vault) {
			xchar hx, hy, lx, ly, dx, dy;
			r1 = rnd_rect(); /* Get a random rectangle */

			if (!r1) /* No more free rectangles ! */
				return FALSE;

			hx = r1->hx;
			hy = r1->hy;
			lx = r1->lx;
			ly = r1->ly;
			if (vault)
			    dx = dy = 1;
			else {
				dx = 2 + rn2((hx-lx > 28) ? 12 : 8);
				dy = 2 + rn2(4);
				if (dx*dy > 50)
				    dy = 50/dx;
			}
			xborder = (lx > 0 && hx < COLNO -1) ? 2*xlim : xlim+1;
			yborder = (ly > 0 && hy < ROWNO -1) ? 2*ylim : ylim+1;
			if (hx-lx < dx + 3 + xborder ||
			   hy-ly < dy + 3 + yborder) {
				r1 = 0;
				continue;
			}
			xabs = lx + (lx > 0 ? xlim : 3)
			    + rn2(hx - (lx>0?lx : 3) - dx - xborder + 1);
			yabs = ly + (ly > 0 ? ylim : 2)
			    + rn2(hy - (ly>0?ly : 2) - dy - yborder + 1);
			if (ly == 0 && hy >= (ROWNO-1) &&
			    (!lev->nroom || !rn2(lev->nroom)) && (yabs+dy > ROWNO/2)) {
			    yabs = rn1(3, 2);
			    if (lev->nroom < 4 && dy>1) dy--;
		        }
			if (!check_room(lev, &xabs, &dx, &yabs, &dy, vault)) {
				r1 = 0;
				continue;
			}
			wtmp = dx+1;
			htmp = dy+1;
			r2.lx = xabs-1; r2.ly = yabs-1;
			r2.hx = xabs + wtmp;
			r2.hy = yabs + htmp;
		} else {	/* Only some parameters are random */
			int rndpos = 0;
			if (xtmp < 0 && ytmp < 0) { /* Position is RANDOM */
				xtmp = rnd(5);
				ytmp = rnd(5);
				rndpos = 1;
			}
			if (wtmp < 0 || htmp < 0) { /* Size is RANDOM */
				wtmp = rn1(15, 3);
				htmp = rn1(8, 2);
			}
			if (xaltmp == -1) /* Horizontal alignment is RANDOM */
			    xaltmp = rnd(3);
			if (yaltmp == -1) /* Vertical alignment is RANDOM */
			    yaltmp = rnd(3);

			/* Try to generate real (absolute) coordinates here! */

			xabs = (((xtmp-1) * COLNO) / 5) + 1;
			yabs = (((ytmp-1) * ROWNO) / 5) + 1;
			switch (xaltmp) {
			      case LEFT:
				break;
			      case RIGHT:
				xabs += (COLNO / 5) - wtmp;
				break;
			      case CENTER:
				xabs += ((COLNO / 5) - wtmp) / 2;
				break;
			}
			switch (yaltmp) {
			      case TOP:
				break;
			      case BOTTOM:
				yabs += (ROWNO / 5) - htmp;
				break;
			      case CENTER:
				yabs += ((ROWNO / 5) - htmp) / 2;
				break;
			}

			if (xabs + wtmp - 1 > COLNO - 2)
			    xabs = COLNO - wtmp - 3;
			if (xabs < 2)
			    xabs = 2;
			if (yabs + htmp - 1> ROWNO - 2)
			    yabs = ROWNO - htmp - 3;
			if (yabs < 2)
			    yabs = 2;

			/* Try to find a rectangle that fit our room ! */

			r2.lx = xabs-1; r2.ly = yabs-1;
			r2.hx = xabs + wtmp + rndpos;
			r2.hy = yabs + htmp + rndpos;
			r1 = get_rect(&r2);
		}
	} while (++trycnt <= 100 && !r1);
	if (!r1) {	/* creation of room failed ? */
		return FALSE;
	}
	split_rects(r1, &r2);

	if (!vault) {
		smeq[lev->nroom] = lev->nroom;
		add_room(lev, xabs, yabs, xabs+wtmp-1, yabs+htmp-1,
			 rlit, rtype, FALSE);
	} else {
		lev->rooms[lev->nroom].lx = xabs;
		lev->rooms[lev->nroom].ly = yabs;
	}
	return TRUE;
}